

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int av1_estimate_bits_at_q(AV1_COMP *cpi,int q,double correction_factor)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (cpi->common).mi_params.MBs;
  iVar1 = av1_rc_bits_per_mb(cpi,(cpi->common).current_frame.frame_type,q,correction_factor,
                             (cpi->sf).hl_sf.accurate_bit_estimate);
  iVar2 = iVar1 * iVar2 >> 9;
  if (iVar2 < 0xc9) {
    iVar2 = 200;
  }
  return iVar2;
}

Assistant:

int av1_estimate_bits_at_q(const AV1_COMP *cpi, int q,
                           double correction_factor) {
  const AV1_COMMON *const cm = &cpi->common;
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;
  const int mbs = cm->mi_params.MBs;
  const int bpm =
      (int)(av1_rc_bits_per_mb(cpi, frame_type, q, correction_factor,
                               cpi->sf.hl_sf.accurate_bit_estimate));
  return AOMMAX(FRAME_OVERHEAD_BITS,
                (int)((uint64_t)bpm * mbs) >> BPER_MB_NORMBITS);
}